

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O3

string * __thiscall
bf_crc::show_reflect_output_abi_cxx11_(string *__return_storage_ptr__,bf_crc *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "uint32_t reflect_output(uint32_t  x ) {\n  uint32_t reflection = 0;\n  uint32_t const  one = 1;\n  uint32_t width_ = 16;\n  for( uint32_t i = 0 ; i < width_ ; ++i, x >>= 1 ) {\n    if ( x & one )\n      reflection |= ( one << (width_ - 1u - i) );\n  }\n  return reflection;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string bf_crc::show_reflect_output (void) {
    return 	"uint32_t reflect_output(uint32_t  x ) {\n"
        "  uint32_t reflection = 0;\n"
        "  uint32_t const  one = 1;\n"
        "  uint32_t width_ = 16;\n"
        "  for( uint32_t i = 0 ; i < width_ ; ++i, x >>= 1 ) {\n"
        "    if ( x & one )\n"
        "      reflection |= ( one << (width_ - 1u - i) );\n"
        "  }\n"
        "  return reflection;\n"
        "}\n";
}